

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

int __thiscall TURBOLINECOUNT::CLineCount::init(CLineCount *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  CLineCount *this_local;
  
  this->m_lasterror = 0;
  std::__cxx11::string::operator=((string *)&this->m_lasterrorstring,"");
  this->m_opened = false;
  this->m_auto_close = false;
  this->m_fh = -1;
  this->m_filesize = 0;
  this->m_actual_thread_count = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_threads);
  std::vector<long,_std::allocator<long>_>::clear(&this->m_threadlinecounts);
  return extraout_EAX;
}

Assistant:

void CLineCount::init(void)
{
	m_lasterror = 0;
	m_lasterrorstring = _T("");
	m_opened = false;
	m_auto_close = false;
	m_fh = LCINVALIDHANDLE;
	m_filesize = 0;
	m_actual_thread_count = 0;
#ifdef _WIN32
	m_filemapping = NULL;
#endif
	m_threads.clear();
	m_threadlinecounts.clear();
}